

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O0

bool __thiscall Transform::intersect(Transform *this,Ray *r,float tmin,Hit *h)

{
  uint uVar1;
  Matrix4f local_cc;
  VecUtils local_8c [12];
  Vector3f local_80;
  byte local_71;
  undefined1 local_70 [7];
  bool hit;
  Vector3f local_64;
  undefined1 local_58 [12];
  Vector3f local_4c;
  undefined1 local_40 [8];
  Ray new_r;
  Hit *h_local;
  float tmin_local;
  Ray *r_local;
  Transform *this_local;
  
  new_r._direction.m_elements._4_8_ = h;
  Ray::getOrigin((Ray *)local_58);
  VecUtils::transformPoint((VecUtils *)&local_4c,&this->_m_inverse,(Vector3f *)local_58);
  Ray::getDirection((Ray *)local_70);
  VecUtils::transformDirection((VecUtils *)&local_64,&this->_m_inverse,(Vector3f *)local_70);
  Ray::Ray((Ray *)local_40,&local_4c,&local_64);
  uVar1 = (*this->_object->_vptr_Object3D[2])
                    ((ulong)(uint)tmin,this->_object,local_40,new_r._direction.m_elements._4_8_);
  local_71 = (byte)uVar1 & 1;
  if ((uVar1 & 1) != 0) {
    Matrix4f::transposed(&local_cc,&this->_m_inverse);
    VecUtils::transformDirection
              (local_8c,&local_cc,(Vector3f *)(new_r._direction.m_elements._4_8_ + 0x10));
    Vector3f::normalized(&local_80);
    Vector3f::operator=((Vector3f *)(new_r._direction.m_elements._4_8_ + 0x10),&local_80);
  }
  return (bool)(local_71 & 1);
}

Assistant:

bool Transform::intersect(const Ray &r, float tmin, Hit &h) const {
    Ray new_r(VecUtils::transformPoint(_m_inverse, r.getOrigin()),
              VecUtils::transformDirection(_m_inverse, r.getDirection()));

    bool hit = _object->intersect(new_r, tmin, h);
    if (hit) {
        h.normal = VecUtils::transformDirection(_m_inverse.transposed(), h.normal).normalized();
    }
    return hit;
}